

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void createBackup(string *fileName,int dublicateNumber)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  undefined8 uVar8;
  uint __len;
  string __str;
  string dstPath;
  path src;
  path dst;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  path local_a8;
  path local_68;
  
  std::operator+(&local_68._M_pathname,"backups/",fileName);
  __val = -dublicateNumber;
  if (0 < dublicateNumber) {
    __val = dublicateNumber;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0010bca0;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0010bca0;
      }
      if (uVar5 < 10000) goto LAB_0010bca0;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0010bca0:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,(char)__len - (char)(dublicateNumber >> 0x1f))
  ;
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)dublicateNumber >> 0x1f) + (long)local_e8),__len,__val);
  paVar1 = &local_68._M_pathname.field_2;
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_pathname._M_dataplus._M_p != paVar1) {
    uVar8 = local_68._M_pathname.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_e0 + local_68._M_pathname._M_string_length) {
    uVar7 = 0xf;
    if (local_e8 != local_d8) {
      uVar7 = local_d8[0];
    }
    if (local_e0 + local_68._M_pathname._M_string_length <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_e8,0,(char *)0x0,
                          (ulong)local_68._M_pathname._M_dataplus._M_p);
      goto LAB_0010bd33;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_e8);
LAB_0010bd33:
  local_a8._M_pathname._M_dataplus._M_p = (pointer)&local_a8._M_pathname.field_2;
  psVar6 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_a8._M_pathname.field_2._M_allocated_capacity = *psVar6;
    local_a8._M_pathname.field_2._8_8_ = puVar3[3];
  }
  else {
    local_a8._M_pathname.field_2._M_allocated_capacity = *psVar6;
    local_a8._M_pathname._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_a8._M_pathname._M_string_length = puVar3[1];
  *puVar3 = psVar6;
  puVar3[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_c8.field_2._M_allocated_capacity = *psVar6;
    local_c8.field_2._8_8_ = plVar4[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar6;
    local_c8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_pathname._M_dataplus._M_p != &local_a8._M_pathname.field_2) {
    operator_delete(local_a8._M_pathname._M_dataplus._M_p,
                    local_a8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_pathname._M_dataplus._M_p,
                    local_68._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_a8,fileName);
  std::experimental::filesystem::v1::__cxx11::path::
  path<char[8],std::experimental::filesystem::v1::__cxx11::path>(&local_68,(char (*) [8])"backups");
  std::experimental::filesystem::v1::create_directory(&local_68);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_68,&local_c8);
  std::experimental::filesystem::v1::copy(&local_a8,&local_68,overwrite_existing);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createBackup(std::string fileName, int dublicateNumber) {
    std::string dstPath = "backups/" + fileName + std::to_string(dublicateNumber) + ".log";
    const std::experimental::filesystem::path src = fileName;
    std::experimental::filesystem::create_directory("backups");
    const std::experimental::filesystem::path dst = dstPath;
    std::experimental::filesystem::copy(src, dst, std::experimental::filesystem::copy_options::overwrite_existing);
}